

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O1

StmNode * __thiscall Translator::visit(Translator *this,IfNode *ifNode)

{
  IfNode *pIVar1;
  int iVar2;
  Label *this_00;
  Label *this_01;
  Label *this_02;
  SEQ *pSVar3;
  CJUMP *pCVar4;
  undefined4 extraout_var;
  ExprNode *pEVar5;
  undefined4 extraout_var_00;
  JUMP *this_03;
  NAME *this_04;
  SEQ *pSVar6;
  LABEL *pLVar7;
  SEQ *pSVar8;
  undefined4 extraout_var_01;
  LABEL *pLVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char endlabelName [200];
  char elseLabelName [200];
  char thenLabelName [200];
  IfNode *local_2c0;
  SEQ *local_2b8;
  SEQ *local_2b0;
  LABEL *local_2a8;
  SEQ *local_2a0;
  char local_298 [208];
  char local_1c8 [208];
  char local_f8 [200];
  
  local_2c0 = ifNode;
  sprintf(local_f8,"if_then_%p",&local_2c0);
  sprintf(local_298,"if_end_%p",&local_2c0);
  this_00 = (Label *)operator_new(0x10);
  Label::Label(this_00,local_f8);
  this_01 = (Label *)operator_new(0x10);
  Label::Label(this_01,local_298);
  pIVar1 = local_2c0;
  if (local_2c0->falseStmt == (StmtNode *)0x0) {
    if (local_2c0->trueStmt != (StmtNode *)0x0) {
      pSVar3 = (SEQ *)operator_new(0x20);
      pCVar4 = (CJUMP *)operator_new(0x30);
      iVar2 = (*(pIVar1->head->super_StmtNode).super_ASTNode._vptr_ASTNode[4])();
      pEVar5 = (ExprNode *)operator_new(0x10);
      CONST::CONST((CONST *)pEVar5,0);
      CJUMP::CJUMP(pCVar4,4,(ExprNode *)CONCAT44(extraout_var_02,iVar2),pEVar5,this_00,this_01);
      pSVar6 = (SEQ *)operator_new(0x20);
      pLVar7 = (LABEL *)operator_new(0x18);
      LABEL::LABEL(pLVar7,this_00);
      pSVar8 = (SEQ *)operator_new(0x20);
      iVar2 = (*(local_2c0->trueStmt->super_ASTNode)._vptr_ASTNode[4])(local_2c0->trueStmt,this);
      pLVar9 = (LABEL *)operator_new(0x18);
      LABEL::LABEL(pLVar9,this_01);
      SEQ::SEQ(pSVar8,(StmNode *)CONCAT44(extraout_var_03,iVar2),(StmNode *)pLVar9);
      SEQ::SEQ(pSVar6,(StmNode *)pLVar7,(StmNode *)pSVar8);
      SEQ::SEQ(pSVar3,(StmNode *)pCVar4,(StmNode *)pSVar6);
      return &pSVar3->super_StmNode;
    }
  }
  else if (local_2c0->trueStmt != (StmtNode *)0x0) {
    sprintf(local_1c8,"if_else_%p",&local_2c0);
    this_02 = (Label *)operator_new(0x10);
    Label::Label(this_02,local_1c8);
    pSVar3 = (SEQ *)operator_new(0x20);
    pCVar4 = (CJUMP *)operator_new(0x30);
    iVar2 = (*(local_2c0->head->super_StmtNode).super_ASTNode._vptr_ASTNode[4])();
    pEVar5 = (ExprNode *)operator_new(0x10);
    CONST::CONST((CONST *)pEVar5,0);
    CJUMP::CJUMP(pCVar4,4,(ExprNode *)CONCAT44(extraout_var,iVar2),pEVar5,this_00,this_02);
    local_2a0 = (SEQ *)operator_new(0x20);
    local_2a8 = (LABEL *)operator_new(0x18);
    LABEL::LABEL(local_2a8,this_00);
    local_2b0 = (SEQ *)operator_new(0x20);
    local_2b8 = (SEQ *)operator_new(0x20);
    iVar2 = (*(local_2c0->trueStmt->super_ASTNode)._vptr_ASTNode[4])(local_2c0->trueStmt,this);
    this_03 = (JUMP *)operator_new(0x20);
    this_04 = (NAME *)operator_new(0x18);
    NAME::NAME(this_04,this_01);
    JUMP::JUMP(this_03,(ExprNode *)this_04,(LabelList *)0x0);
    SEQ::SEQ(local_2b8,(StmNode *)CONCAT44(extraout_var_00,iVar2),(StmNode *)this_03);
    pSVar6 = (SEQ *)operator_new(0x20);
    pLVar7 = (LABEL *)operator_new(0x18);
    LABEL::LABEL(pLVar7,this_02);
    pSVar8 = (SEQ *)operator_new(0x20);
    iVar2 = (*(local_2c0->falseStmt->super_ASTNode)._vptr_ASTNode[4])(local_2c0->falseStmt,this);
    pLVar9 = (LABEL *)operator_new(0x18);
    LABEL::LABEL(pLVar9,this_01);
    SEQ::SEQ(pSVar8,(StmNode *)CONCAT44(extraout_var_01,iVar2),(StmNode *)pLVar9);
    SEQ::SEQ(pSVar6,(StmNode *)pLVar7,(StmNode *)pSVar8);
    SEQ::SEQ(local_2b0,&local_2b8->super_StmNode,(StmNode *)pSVar6);
    SEQ::SEQ(local_2a0,&local_2a8->super_StmNode,&local_2b0->super_StmNode);
    SEQ::SEQ(pSVar3,(StmNode *)pCVar4,&local_2a0->super_StmNode);
    return &pSVar3->super_StmNode;
  }
  return (StmNode *)0x0;
}

Assistant:

StmNode *Translator::visit(IfNode *ifNode) {
    char thenLabelName[200];
    char endlabelName[200];
    sprintf(thenLabelName, "if_then_%p", &ifNode);
    sprintf(endlabelName, "if_end_%p", &ifNode);
    Label *thenLabel = new Label(thenLabelName);
    Label *endLabel = new Label(endlabelName);

    // sem else
    if (ifNode->getFalseStmt() == nullptr && ifNode->getTrueStmt() != nullptr) {
        return new SEQ(new CJUMP(NE, ifNode->getHead()->accept(this), new CONST(0), thenLabel, endLabel),
                       new SEQ(new LABEL(thenLabel),
                               new SEQ(ifNode->getTrueStmt()->accept(this),
                                       new LABEL(endLabel))));
    } else if (ifNode->getFalseStmt() != nullptr && ifNode->getTrueStmt() != nullptr) {// com else
        char elseLabelName[200];
        sprintf(elseLabelName, "if_else_%p", &ifNode);
        Label *elseLabel = new Label(elseLabelName);
        return new SEQ(new CJUMP(NE, ifNode->getHead()->accept(this), new CONST(0), thenLabel, elseLabel),
                       new SEQ(new LABEL(thenLabel),
                               new SEQ(new SEQ(ifNode->getTrueStmt()->accept(this),
                                               // TODO eu to passando nullptr pra todos os targets dos jumps
                                               new JUMP(new NAME(endLabel), nullptr)),
                                       new SEQ(new LABEL(elseLabel),
                                               new SEQ(ifNode->getFalseStmt()->accept(this),
                                                       new LABEL(endLabel))))));
    } else {
        return NULL;
    }
}